

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::CreateContext::CreateContext
          (CreateContext *this,EGLDisplay display,EGLConfig config,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *shared,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *context)

{
  GLES2Context *pGVar1;
  GLES2Context *pGVar2;
  GLES2ResourceManager *ptr;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager> local_70;
  SharedPtr<tcu::ThreadUtil::Event> local_60;
  SharedPtr<tcu::ThreadUtil::Object> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_40;
  
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"CreateContext");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__CreateContext_01e00228;
  this->m_display = display;
  this->m_config = config;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(&this->m_shared,shared);
  (this->m_context).m_ptr = (GLES2Context *)0x0;
  (this->m_context).m_state = (SharedPtrStateBase *)0x0;
  pGVar2 = shared->m_ptr;
  if (pGVar2 != (GLES2Context *)0x0) {
    local_50.m_state = shared->m_state;
    if (local_50.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_50.m_state)->strongRefCount = (local_50.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_50.m_state)->weakRefCount = (local_50.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_50.m_ptr = &pGVar2->super_Object;
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_50);
    de::SharedPtr<tcu::ThreadUtil::Object>::release(&local_50);
  }
  pGVar2 = (GLES2Context *)operator_new(0x60);
  local_60.m_ptr = (this->super_Operation).m_event.m_ptr;
  local_60.m_state = (this->super_Operation).m_event.m_state;
  if (local_60.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_60.m_state)->strongRefCount = (local_60.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_60.m_state)->weakRefCount = (local_60.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  pGVar1 = shared->m_ptr;
  if (pGVar1 == (GLES2Context *)0x0) {
    ptr = (GLES2ResourceManager *)operator_new(0x60);
    (ptr->m_programs).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptr->m_programs).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (ptr->m_shaders).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (ptr->m_programs).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ptr->m_shaders).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ptr->m_shaders).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptr->m_buffers).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptr->m_buffers).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (ptr->m_textures).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (ptr->m_buffers).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ptr->m_textures).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ptr->m_textures).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager>::SharedPtr(&local_70,ptr);
  }
  else {
    local_70.m_ptr = (pGVar1->resourceManager).m_ptr;
    local_70.m_state = (pGVar1->resourceManager).m_state;
    if (local_70.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_70.m_state)->strongRefCount = (local_70.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_70.m_state)->weakRefCount = (local_70.m_state)->weakRefCount + 1;
      UNLOCK();
    }
  }
  GLES2Context::GLES2Context(pGVar2,&local_60,&local_70);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(&local_40,pGVar2);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator=(context,&local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager>::release(&local_70);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator=(&this->m_context,context);
  return;
}

Assistant:

CreateContext::CreateContext (EGLDisplay display, EGLConfig config, SharedPtr<GLES2Context> shared, SharedPtr<GLES2Context>& context)
	: tcu::ThreadUtil::Operation	("CreateContext")
	, m_display					(display)
	, m_config					(config)
	, m_shared					(shared)
{
	if (shared)
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(shared));

	context = SharedPtr<GLES2Context>(new GLES2Context(getEvent(), (shared ? shared->resourceManager : SharedPtr<GLES2ResourceManager>(new GLES2ResourceManager))));
	m_context = context;
}